

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O3

asn_dec_rval_t
NativeEnumerated_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  long *plVar1;
  int32_t iVar2;
  undefined8 *puVar3;
  ssize_t sVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  asn_dec_rval_t aVar8;
  
  plVar1 = (long *)td->specifics;
  puVar3 = (undefined8 *)*sptr;
  if (((constraints == (asn_per_constraints_t *)0x0) &&
      (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) ||
     (plVar1 == (long *)0x0)) {
LAB_001411f5:
    uVar7 = 2;
  }
  else {
    if (puVar3 == (undefined8 *)0x0) {
      puVar3 = (undefined8 *)calloc(1,8);
      *sptr = puVar3;
      if (puVar3 == (undefined8 *)0x0) goto LAB_001411f5;
    }
    if (((constraints->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
LAB_0014118f:
      iVar6 = (constraints->value).range_bits;
      if (iVar6 < 0) goto LAB_001411c7;
      iVar2 = per_get_few_bits(pd,iVar6);
      if (iVar2 < 0) {
LAB_0014120d:
        uVar7 = 1;
        goto LAB_001411fa;
      }
      if (*(int *)((long)plVar1 + 0x14) == 0) {
        iVar6 = (int)plVar1[2];
      }
      else {
        iVar6 = *(int *)((long)plVar1 + 0x14) + -1;
      }
      uVar7 = 2;
      if (iVar6 <= iVar2) goto LAB_001411fa;
      lVar5 = (long)iVar2;
    }
    else {
      uVar7 = 1;
      iVar2 = per_get_few_bits(pd,1);
      if (iVar2 < 0) goto LAB_001411fa;
      if (iVar2 == 0) goto LAB_0014118f;
LAB_001411c7:
      if (*(int *)((long)plVar1 + 0x14) == 0) goto LAB_001411f5;
      sVar4 = uper_get_nsnnwn(pd);
      if (sVar4 < 0) goto LAB_0014120d;
      lVar5 = sVar4 + *(int *)((long)plVar1 + 0x14) + -1;
      uVar7 = 2;
      if ((int)plVar1[2] <= lVar5) goto LAB_001411fa;
    }
    *puVar3 = *(undefined8 *)(*plVar1 + lVar5 * 0x18);
    uVar7 = 0;
  }
LAB_001411fa:
  aVar8.consumed = 0;
  aVar8._0_8_ = uVar7;
  return aVar8;
}

Assistant:

asn_dec_rval_t
NativeEnumerated_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs = (asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	long *native = (long *)*sptr;
	asn_per_constraint_t *ct;
	long value;

	(void)opt_codec_ctx;

	if(constraints) ct = &constraints->value;
	else if(td->per_constraints) ct = &td->per_constraints->value;
	else ASN__DECODE_FAILED;	/* Mandatory! */
	if(!specs) ASN__DECODE_FAILED;

	if(!native) {
		native = (long *)(*sptr = CALLOC(1, sizeof(*native)));
		if(!native) ASN__DECODE_FAILED;
	}

	ASN_DEBUG("Decoding %s as NativeEnumerated", td->name);

	if(ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	if(ct && ct->range_bits >= 0) {
		value = per_get_few_bits(pd, ct->range_bits);
		if(value < 0) ASN__DECODE_STARVED;
		if(value >= (specs->extension
			? specs->extension - 1 : specs->map_count))
			ASN__DECODE_FAILED;
	} else {
		if(!specs->extension)
			ASN__DECODE_FAILED;
		/*
		 * X.691, #10.6: normally small non-negative whole number;
		 */
		value = uper_get_nsnnwn(pd);
		if(value < 0) ASN__DECODE_STARVED;
		value += specs->extension - 1;
		if(value >= specs->map_count)
			ASN__DECODE_FAILED;
	}

	*native = specs->value2enum[value].nat_value;
	ASN_DEBUG("Decoded %s = %ld", td->name, *native);

	return rval;
}